

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_utility.cpp
# Opt level: O0

void __thiscall
FNodeBuilder::FVertexMap::FVertexMap
          (FVertexMap *this,FNodeBuilder *builder,fixed_t minx,fixed_t miny,fixed_t maxx,
          fixed_t maxy)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  ulong *puVar4;
  TArray<int,_int> *pTVar5;
  ulong uVar6;
  TArray<int,_int> *local_68;
  fixed_t maxy_local;
  fixed_t maxx_local;
  fixed_t miny_local;
  fixed_t minx_local;
  FNodeBuilder *builder_local;
  FVertexMap *this_local;
  
  IVertexMap::IVertexMap(&this->super_IVertexMap);
  (this->super_IVertexMap)._vptr_IVertexMap = (_func_int **)&PTR__FVertexMap_00b6c458;
  this->MyBuilder = builder;
  this->MinX = minx;
  this->MinY = miny;
  this->BlocksWide =
       (int)((((double)maxx - (double)minx) + 1.0 + 16777215.0) * 5.9604644775390625e-08);
  this->BlocksTall =
       (int)((((double)maxy - (double)miny) + 1.0 + 16777215.0) * 5.9604644775390625e-08);
  this->MaxX = this->MinX + -1 + this->BlocksWide * 0x1000000;
  this->MaxY = this->MinY + -1 + this->BlocksTall * 0x1000000;
  uVar2 = (ulong)(this->BlocksWide * this->BlocksTall);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar2;
  uVar3 = SUB168(auVar1 * ZEXT816(0x10),0);
  uVar6 = uVar3 + 8;
  if (0xfffffffffffffff7 < uVar3) {
    uVar6 = 0xffffffffffffffff;
  }
  if (SUB168(auVar1 * ZEXT816(0x10),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  puVar4 = (ulong *)operator_new__(uVar6);
  *puVar4 = uVar2;
  pTVar5 = (TArray<int,_int> *)(puVar4 + 1);
  if (uVar2 != 0) {
    local_68 = pTVar5;
    do {
      TArray<int,_int>::TArray(local_68);
      local_68 = local_68 + 1;
    } while (local_68 != pTVar5 + uVar2);
  }
  this->VertexGrid = pTVar5;
  return;
}

Assistant:

FNodeBuilder::FVertexMap::FVertexMap (FNodeBuilder &builder,
	fixed_t minx, fixed_t miny, fixed_t maxx, fixed_t maxy)
	: MyBuilder(builder)
{
	MinX = minx;
	MinY = miny;
	BlocksWide = int(((double(maxx) - minx + 1) + (BLOCK_SIZE - 1)) / BLOCK_SIZE);
	BlocksTall = int(((double(maxy) - miny + 1) + (BLOCK_SIZE - 1)) / BLOCK_SIZE);
	MaxX = MinX + BlocksWide * BLOCK_SIZE - 1;
	MaxY = MinY + BlocksTall * BLOCK_SIZE - 1;
	VertexGrid = new TArray<int>[BlocksWide * BlocksTall];
}